

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class2_test_homography.cc
# Opt level: O2

void denormalize_correspondences
               (Correspondences2D2D *corr,int width1,int height1,int width2,int height2)

{
  reference pvVar1;
  size_t i;
  ulong __n;
  float fVar2;
  float fVar3;
  
  fVar2 = (float)height1;
  if (height1 < width1) {
    height1 = width1;
  }
  fVar3 = (float)height2;
  if (height2 < width2) {
    height2 = width2;
  }
  for (__n = 0; __n < (ulong)((long)(corr->
                                    super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(corr->
                                    super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1)
  {
    pvVar1 = std::vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>::at
                       (corr,__n);
    pvVar1->p1[0] = pvVar1->p1[0] * (double)height1 + (double)((float)width1 * 0.5) + -0.5;
    pvVar1->p1[1] = pvVar1->p1[1] * (double)height1 + (double)(fVar2 * 0.5) + -0.5;
    pvVar1->p2[0] = pvVar1->p2[0] * (double)height2 + (double)((float)width2 * 0.5) + -0.5;
    pvVar1->p2[1] = pvVar1->p2[1] * (double)height2 + (double)(fVar3 * 0.5) + -0.5;
  }
  return;
}

Assistant:

void
denormalize_correspondences (sfm::Correspondences2D2D * corr, int width1, int height1,
    int width2, int height2)
{
    float const img1_width = static_cast<float>(width1);
    float const img1_height = static_cast<float>(height1);
    float const img1_maxdim = static_cast<float>(std::max(width1, height1));
    float const img2_width = static_cast<float>(width2);
    float const img2_height = static_cast<float>(height2);
    float const img2_maxdim = static_cast<float>(std::max(width2, height2));
    for (std::size_t i = 0; i < corr->size(); ++i)
    {
        sfm::Correspondence2D2D & c = corr->at(i);
        c.p1[0] = c.p1[0] * img1_maxdim + img1_width / 2.0f - 0.5f;
        c.p1[1] = c.p1[1] * img1_maxdim + img1_height / 2.0f - 0.5f;
        c.p2[0] = c.p2[0] * img2_maxdim + img2_width / 2.0f - 0.5f;
        c.p2[1] = c.p2[1] * img2_maxdim + img2_height / 2.0f - 0.5f;
    }
}